

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm_sse2.c
# Opt level: O2

void av1_lowbd_fwd_txfm2d_16x4_sse2
               (int16_t *input,int32_t *output,int stride,TX_TYPE tx_type,int bd)

{
  code *pcVar1;
  code *pcVar2;
  undefined1 auVar3 [12];
  undefined1 auVar4 [12];
  int8_t *piVar5;
  int out_size;
  undefined7 in_register_00000009;
  code *pcVar6;
  ulong uVar7;
  long lVar8;
  __m128i *out;
  undefined4 uVar9;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined4 uVar14;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  __m128i buf1 [16];
  __m128i buf0 [16];
  undefined1 auVar10 [12];
  undefined1 auVar11 [16];
  undefined1 auVar15 [12];
  undefined1 auVar16 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  
  piVar5 = av1_fwd_txfm_shift_ls[0xe];
  uVar7 = (ulong)(uint)((int)CONCAT71(in_register_00000009,tx_type) << 3);
  pcVar1 = *(code **)((long)col_txfm8x4_arr + uVar7);
  pcVar2 = *(code **)((long)row_txfm8x16_arr + uVar7);
  out = buf0;
  pcVar6 = pcVar2;
  for (lVar8 = 0; out_size = (int)pcVar6, lVar8 != 0x20; lVar8 = lVar8 + 0x10) {
    if ((0xbeafU >> (tx_type & 0x1f) & 1) == 0 && tx_type < 0x10) {
      pcVar6 = (code *)&DAT_00000004;
      load_buffer_16bit_to_16bit_flip((int16_t *)((long)input + lVar8),stride,out,4);
    }
    else {
      pcVar6 = (code *)&DAT_00000004;
      load_buffer_16bit_to_16bit((int16_t *)((long)input + lVar8),stride,out,4);
    }
    round_shift_16bit(out,4,(int)*piVar5);
    (*pcVar1)(out,out,0xd);
    round_shift_16bit(out,4,(int)piVar5[1]);
    auVar21._0_12_ = buf0[0]._0_12_;
    auVar21._12_2_ = buf0[0][0]._6_2_;
    auVar21._14_2_ = buf0[1][0]._6_2_;
    auVar20._12_4_ = auVar21._12_4_;
    auVar20._0_10_ = buf0[0]._0_10_;
    auVar20._10_2_ = buf0[1][0]._4_2_;
    auVar19._10_6_ = auVar20._10_6_;
    auVar19._0_8_ = buf0[0][0];
    auVar19._8_2_ = buf0[0][0]._4_2_;
    auVar3._4_8_ = auVar19._8_8_;
    auVar3._2_2_ = buf0[1][0]._2_2_;
    auVar3._0_2_ = buf0[0][0]._2_2_;
    auVar18._0_4_ = CONCAT22((undefined2)buf0[1][0],(short)buf0[0][0]);
    auVar18._4_12_ = auVar3;
    auVar25._0_12_ = buf0[2]._0_12_;
    auVar25._12_2_ = buf0[2][0]._6_2_;
    auVar25._14_2_ = buf0[3][0]._6_2_;
    auVar24._12_4_ = auVar25._12_4_;
    auVar24._0_10_ = buf0[2]._0_10_;
    auVar24._10_2_ = buf0[3][0]._4_2_;
    auVar23._10_6_ = auVar24._10_6_;
    auVar23._0_8_ = buf0[2][0];
    auVar23._8_2_ = buf0[2][0]._4_2_;
    auVar4._4_8_ = auVar23._8_8_;
    auVar4._2_2_ = buf0[3][0]._2_2_;
    auVar4._0_2_ = buf0[2][0]._2_2_;
    uVar9 = CONCAT22((undefined2)buf0[1][1],(short)buf0[0][1]);
    auVar10._0_8_ = CONCAT26(buf0[1][1]._2_2_,CONCAT24(buf0[0][1]._2_2_,uVar9));
    auVar10._8_2_ = buf0[0][1]._4_2_;
    auVar10._10_2_ = buf0[1][1]._4_2_;
    auVar11._12_2_ = buf0[0][1]._6_2_;
    auVar11._0_12_ = auVar10;
    auVar11._14_2_ = buf0[1][1]._6_2_;
    uVar14 = CONCAT22((undefined2)buf0[3][1],(short)buf0[2][1]);
    auVar15._0_8_ = CONCAT26(buf0[3][1]._2_2_,CONCAT24(buf0[2][1]._2_2_,uVar14));
    auVar15._8_2_ = buf0[2][1]._4_2_;
    auVar15._10_2_ = buf0[3][1]._4_2_;
    auVar16._12_2_ = buf0[2][1]._6_2_;
    auVar16._0_12_ = auVar15;
    auVar16._14_2_ = buf0[3][1]._6_2_;
    auVar13._0_8_ = auVar18._0_8_;
    auVar13._8_4_ = auVar3._0_4_;
    auVar13._12_4_ = auVar4._0_4_;
    auVar17._8_4_ = (int)((ulong)auVar10._0_8_ >> 0x20);
    auVar17._0_8_ = auVar10._0_8_;
    auVar17._12_4_ = (int)((ulong)auVar15._0_8_ >> 0x20);
    auVar22._0_8_ = CONCAT44(auVar23._8_4_,auVar19._8_4_);
    auVar22._8_4_ = auVar20._12_4_;
    auVar22._12_4_ = auVar24._12_4_;
    auVar12._0_8_ = CONCAT44(auVar15._8_4_,auVar10._8_4_);
    auVar12._8_4_ = auVar11._12_4_;
    auVar12._12_4_ = auVar16._12_4_;
    buf1[0][lVar8] = CONCAT44(CONCAT22((undefined2)buf0[3][0],(short)buf0[2][0]),auVar18._0_4_);
    buf1[0][lVar8 + 1] = 0;
    buf1[1][lVar8] = auVar13._8_8_;
    buf1[1][lVar8 + 1] = 0;
    buf1[2][lVar8] = auVar22._0_8_;
    buf1[2][lVar8 + 1] = 0;
    *(undefined1 (*) [16])(buf1[3] + lVar8) = auVar22 >> 0x40;
    buf1[4][lVar8] = CONCAT44(uVar14,uVar9);
    buf1[4][lVar8 + 1] = 0;
    buf1[5][lVar8] = auVar17._8_8_;
    buf1[5][lVar8 + 1] = 0;
    buf1[6][lVar8] = auVar12._0_8_;
    buf1[6][lVar8 + 1] = 0;
    *(undefined1 (*) [16])(buf1[7] + lVar8) = auVar12 >> 0x40;
  }
  if ((0x7f1fU >> (tx_type & 0x1f) & 1) == 0 && tx_type < 0x10) {
    flip_buf_sse2(buf1,out,0x10);
  }
  else {
    out = buf1;
  }
  (*pcVar2)(out,out,0xd);
  round_shift_16bit(out,0x10,(int)piVar5[2]);
  store_buffer_16bit_to_32bit_w4(out,output,0x10,out_size);
  return;
}

Assistant:

void av1_lowbd_fwd_txfm2d_16x4_sse2(const int16_t *input, int32_t *output,
                                    int stride, TX_TYPE tx_type, int bd) {
  (void)bd;
  __m128i buf0[16], buf1[16];
  const int8_t *shift = av1_fwd_txfm_shift_ls[TX_16X4];
  const int txw_idx = get_txw_idx(TX_16X4);
  const int txh_idx = get_txh_idx(TX_16X4);
  const int cos_bit_col = av1_fwd_cos_bit_col[txw_idx][txh_idx];
  const int cos_bit_row = av1_fwd_cos_bit_row[txw_idx][txh_idx];
  const int width = 16;
  const int height = 4;
  const transform_1d_sse2 col_txfm = col_txfm8x4_arr[tx_type];
  const transform_1d_sse2 row_txfm = row_txfm8x16_arr[tx_type];
  __m128i *buf;
  int ud_flip, lr_flip;

  get_flip_cfg(tx_type, &ud_flip, &lr_flip);
  for (int i = 0; i < 2; i++) {
    if (ud_flip) {
      load_buffer_16bit_to_16bit_flip(input + 8 * i, stride, buf0, height);
    } else {
      load_buffer_16bit_to_16bit(input + 8 * i, stride, buf0, height);
    }
    round_shift_16bit(buf0, height, shift[0]);
    col_txfm(buf0, buf0, cos_bit_col);
    round_shift_16bit(buf0, height, shift[1]);
    transpose_16bit_8x4(buf0, buf1 + 8 * i);
  }

  if (lr_flip) {
    buf = buf0;
    flip_buf_sse2(buf1, buf, width);
  } else {
    buf = buf1;
  }
  row_txfm(buf, buf, cos_bit_row);
  round_shift_16bit(buf, width, shift[2]);
  store_buffer_16bit_to_32bit_w4(buf, output, height, width);
}